

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O0

void Ptex::v2_2::(anonymous_namespace)::ApplyS<float,2>
               (PtexTriangleKernelIter *k,float *result,void *data,int param_4,int nTxChan)

{
  float fVar1;
  int iVar2;
  int iVar3;
  VecAccum<float,_2> *this;
  VecAccum<float,_2> *dst;
  long in_RDX;
  int *in_RDI;
  int in_R8D;
  float fVar4;
  float fVar5;
  float weight;
  float *pEnd;
  float *p;
  float Q;
  float DQ;
  float V;
  float U;
  int x2;
  int x1;
  int xw;
  int vi;
  float DDQ;
  float in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  float local_44;
  float local_40;
  int local_28;
  
  fVar1 = (float)in_RDI[9];
  for (local_28 = in_RDI[4]; local_28 != in_RDI[7]; local_28 = local_28 + 1) {
    iVar3 = *in_RDI;
    iVar2 = PtexUtils::max<int>(in_RDI[3],(iVar3 - local_28) - in_RDI[8]);
    iVar3 = PtexUtils::min<int>(in_RDI[6],(iVar3 - local_28) - in_RDI[5]);
    fVar4 = (float)iVar2 - (float)in_RDI[1];
    fVar5 = (float)local_28 - (float)in_RDI[2];
    local_40 = (float)in_RDI[9] * (fVar4 + fVar4 + 1.0) + (float)in_RDI[10] * fVar5;
    local_44 = (float)in_RDI[9] * fVar4 * fVar4 +
               ((float)in_RDI[10] * fVar4 + (float)in_RDI[0xb] * fVar5) * fVar5;
    this = (VecAccum<float,_2> *)(in_RDX + (long)((local_28 * *in_RDI + iVar2) * in_R8D) * 4);
    dst = this + (long)((iVar3 - iVar2) * in_R8D) * 4;
    for (; this < dst; this = this + (long)in_R8D * 4) {
      if (local_44 < 1.0) {
        fVar4 = anon_unknown_2::gaussian(0.0);
        fVar4 = fVar4 * (float)in_RDI[0xd];
        in_RDI[0xe] = (int)(fVar4 + (float)in_RDI[0xe]);
        PtexUtils::VecAccum<float,_2>::VecAccum((VecAccum<float,_2> *)&stack0xffffffffffffffa3);
        PtexUtils::VecAccum<float,_2>::operator()
                  (this,(float *)dst,(float *)CONCAT44(fVar4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff9c);
      }
      local_44 = local_40 + local_44;
      local_40 = fVar1 * 2.0 + local_40;
    }
  }
  return;
}

Assistant:

void ApplyS(PtexTriangleKernelIter& k, float* result, void* data, int /*nChan*/, int nTxChan)
    {
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccum<T,nChan>()(result, p, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }